

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *this)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff70;
  TPZTriangleTorus *in_stack_ffffffffffffff90;
  int64_t *local_60;
  TPZGeoElSideIndex local_40;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZTriangleTorus>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245f790);
  TPZGeoEl::TPZGeoEl(in_RDI,&PTR_PTR_0245f778);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  pzgeom::TPZTriangleTorus::TPZTriangleTorus(in_stack_ffffffffffffff90);
  local_60 = (int64_t *)&in_RDI[7].fMatId;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    local_60 = local_60 + 3;
  } while ((TPZGeoEl *)local_60 != in_RDI + 10);
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[7].fMatId + (long)local_28 * 6),&local_40);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x172463a);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}